

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# echo-vm.c
# Opt level: O2

_Bool call(ObjClosure *closure,int argCount)

{
  ObjFunction *pOVar1;
  long lVar2;
  _Bool _Var3;
  
  pOVar1 = closure->function;
  if (pOVar1->arity == argCount) {
    lVar2 = (long)vm.frameCount;
    if (lVar2 == 0x40) {
      _Var3 = false;
      runtimeError("Stack overflow.");
    }
    else {
      vm.frameCount = vm.frameCount + 1;
      vm.frames[lVar2].closure = closure;
      vm.frames[lVar2].ip = (pOVar1->chunk).code;
      vm.frames[lVar2].slots = vm.stackTop + (-1 - (ulong)(uint)argCount);
      _Var3 = true;
    }
  }
  else {
    _Var3 = false;
    runtimeError("Expected %d arguments but got %d.");
  }
  return _Var3;
}

Assistant:

static bool call(ObjClosure* closure, int argCount) {
    //Arity Check
    if (argCount != closure->function->arity) {
        runtimeError("Expected %d arguments but got %d.",
                     closure->function->arity, argCount);
        return false;
    }

    if (vm.frameCount == FRAMES_MAX) {
        runtimeError("Stack overflow.");
        return false;
    }

    CallFrame *frame = &vm.frames[vm.frameCount++];
    frame->closure = closure;
    frame->ip = closure->function->chunk.code;

    //-1 to skip slot zero
    frame->slots = vm.stackTop - argCount - 1;
    return true;
}